

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::Skeleton::newPickElement(Skeleton *this,int *pickID,Joint *joint)

{
  mapped_type pJVar1;
  mapped_type *ppJVar2;
  uchar local_23;
  uchar local_22;
  uchar local_21;
  uchar B;
  uchar G;
  Joint *pJStack_20;
  uchar R;
  Joint *joint_local;
  int *pickID_local;
  Skeleton *this_local;
  
  pJStack_20 = joint;
  joint_local = (Joint *)pickID;
  pickID_local = (int *)this;
  IndexToRGB(*pickID,&local_21,&local_22,&local_23);
  glColor3ub(local_21,local_22,local_23,local_21);
  pJVar1 = pJStack_20;
  ppJVar2 = std::
            map<int,_CMU462::DynamicScene::Joint_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Joint_*>_>_>
            ::operator[](&this->idToJoint,(key_type_conflict *)joint_local);
  *ppJVar2 = pJVar1;
  *(int *)&(joint_local->super_SceneObject)._vptr_SceneObject =
       *(int *)&(joint_local->super_SceneObject)._vptr_SceneObject + 1;
  return;
}

Assistant:

void Skeleton::newPickElement(int& pickID, Joint* joint)
  {
    unsigned char R, G, B;
    IndexToRGB(pickID, R, G, B);
    glColor3ub(R, G, B);
    idToJoint[pickID] = joint;
    pickID++;
  }